

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O0

bool __thiscall uv::TCPClient::SetKeepAlive(TCPClient *this,int enable,uint delay)

{
  char **__return_storage_ptr__;
  int errcode;
  CStringStream *pCVar1;
  ILog4zManager *pIVar2;
  long *in_FS_OFFSET;
  string local_80;
  undefined1 local_60 [8];
  CStringStream ss;
  int iret;
  uint delay_local;
  int enable_local;
  TCPClient *this_local;
  
  errcode = uv_tcp_keepalive(this->client_handle_,enable,delay);
  if (errcode != 0) {
    __return_storage_ptr__ = &ss.m_pCur;
    GetUVError_abi_cxx11_((string *)__return_storage_ptr__,errcode);
    std::__cxx11::string::operator=((string *)&this->errmsg_,(string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_60,(char *)(*in_FS_OFFSET + -0x800),0x800);
    std::__cxx11::string::string((string *)&local_80,(string *)&this->errmsg_);
    zsummer::log4z::CStringStream::operator<<((CStringStream *)local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    pCVar1 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_60," ( ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ");
    pCVar1 = zsummer::log4z::CStringStream::operator<<(pCVar1," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar1,0xa1);
    pIVar2 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar2->_vptr_ILog4zManager[8])(pIVar2,0,3,*in_FS_OFFSET + -0x800);
  }
  return errcode == 0;
}

Assistant:

bool TCPClient::SetKeepAlive(int enable, unsigned int delay)
{
    int iret = uv_tcp_keepalive(&client_handle_->tcphandle, enable , delay);
    if (iret) {
        errmsg_ = GetUVError(iret);
        LOGE(errmsg_);
        return false;
    }
    return true;
}